

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

vec4 __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::getData_vec4
          (GLAttributeBuffer *this,size_t ind)

{
  vec<4,_float,_(glm::qualifier)0> vVar1;
  vec4 vVar2;
  string local_40;
  
  if ((this->super_AttributeBuffer).dataType != Vector4Float) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bad getData type","");
    exception(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  vVar1 = getData_helper<glm::vec<4,float,(glm::qualifier)0>>(this,ind);
  vVar2.field_0 = vVar1.field_0;
  vVar2.field_1 = vVar1.field_1;
  vVar2.field_2 = vVar1.field_2;
  vVar2.field_3 = vVar1.field_3;
  return vVar2;
}

Assistant:

glm::vec4 GLAttributeBuffer::getData_vec4(size_t ind) {
  if (getType() != RenderDataType::Vector4Float) exception("bad getData type");
  return getData_helper<glm::vec4>(ind);
}